

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O3

Vec_Int_t * Abc_NtkCollectCiSupps(Abc_Ntk_t *pNtk,int fVerbose)

{
  uint uVar1;
  void *__ptr;
  uint *__ptr_00;
  Abc_Ntk_t *pAVar2;
  int iVar3;
  uint uVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  void *pvVar7;
  Vec_Ptr_t *pVVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  Vec_Int_t *p;
  long lVar12;
  timespec ts;
  timespec local_98;
  uint *local_80;
  ulong local_78;
  Vec_Int_t *local_70;
  Vec_Ptr_t *local_68;
  int local_5c;
  long local_58;
  Abc_Ntk_t *local_50;
  Vec_Int_t *local_48;
  long local_40;
  long local_38;
  
  iVar3 = clock_gettime(3,&local_98);
  if (iVar3 < 0) {
    local_58 = 1;
  }
  else {
    lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_98.tv_nsec),8);
    local_58 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_98.tv_sec * -1000000;
  }
  piVar6 = (int *)0x0;
  local_5c = fVerbose;
  local_68 = Abc_NtkDfs(pNtk,0);
  local_70 = (Vec_Int_t *)calloc(1,0x10);
  iVar3 = pNtk->vCis->nSize;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  iVar9 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar9 = iVar3;
  }
  pVVar5->nSize = 0;
  pVVar5->nCap = iVar9;
  if (iVar9 != 0) {
    piVar6 = (int *)malloc((long)iVar9 << 2);
  }
  pVVar5->pArray = piVar6;
  uVar1 = pNtk->vObjs->nSize;
  local_80 = (uint *)malloc(0x10);
  uVar4 = 8;
  if (6 < uVar1 - 1) {
    uVar4 = uVar1;
  }
  *local_80 = uVar4;
  local_78 = (ulong)uVar1;
  local_48 = pVVar5;
  if (uVar4 == 0) {
    pvVar7 = (void *)0x0;
  }
  else {
    pvVar7 = calloc((long)(int)uVar4,0x10);
  }
  *(void **)(local_80 + 2) = pvVar7;
  local_80[1] = (uint)local_78;
  pVVar8 = pNtk->vCos;
  local_50 = pNtk;
  if (0 < pVVar8->nSize) {
    lVar10 = 0;
    do {
      iVar3 = *(int *)((long)pVVar8->pArray[lVar10] + 0x10);
      if (((long)iVar3 < 0) || ((int)(uint)local_78 <= iVar3)) goto LAB_002ef18a;
      iVar9 = **(int **)((long)pVVar8->pArray[lVar10] + 0x20);
      if (((long)iVar9 < 0) || ((int)local_80[1] <= iVar9)) goto LAB_002ef18a;
      p = (Vec_Int_t *)((long)iVar3 * 0x10 + (long)pvVar7);
      lVar12 = *(long *)(local_80 + 2);
      lVar11 = (long)iVar9 * 0x10;
      Vec_IntPush(p,(int)lVar10);
      pVVar5 = local_70;
      Vec_IntTwoMerge2((Vec_Int_t *)(lVar12 + lVar11),p,local_70);
      local_98.tv_sec = *(long *)(lVar12 + lVar11);
      local_98.tv_nsec = ((long *)(lVar12 + lVar11))[1];
      piVar6 = pVVar5->pArray;
      *(undefined8 *)(lVar12 + lVar11) = *(undefined8 *)pVVar5;
      ((undefined8 *)(lVar12 + lVar11))[1] = piVar6;
      pVVar5->nCap = (int)local_98.tv_sec;
      pVVar5->nSize = (int)((ulong)local_98.tv_sec >> 0x20);
      pVVar5->pArray = (int *)local_98.tv_nsec;
      lVar10 = lVar10 + 1;
      pVVar8 = local_50->vCos;
    } while (lVar10 < pVVar8->nSize);
  }
  pVVar5 = local_70;
  lVar10 = (long)local_68->nSize;
  if (0 < lVar10) {
    do {
      if (local_68->nSize < lVar10) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      local_38 = lVar10 + -1;
      pvVar7 = local_68->pArray[local_38];
      iVar3 = *(int *)((long)pvVar7 + 0x10);
      local_40 = lVar10;
      if ((long)iVar3 < 0) goto LAB_002ef18a;
      local_78 = CONCAT44(local_78._4_4_,local_80[1]);
      if ((int)local_80[1] <= iVar3) goto LAB_002ef18a;
      if (0 < *(int *)((long)pvVar7 + 0x1c)) {
        lVar10 = *(long *)(local_80 + 2);
        lVar12 = 0;
        do {
          uVar1 = *(uint *)(*(long *)((long)pvVar7 + 0x20) + lVar12 * 4);
          if (((long)(int)uVar1 < 0) || ((uint)local_78 <= uVar1)) goto LAB_002ef18a;
          lVar11 = (long)(int)uVar1 * 0x10;
          Vec_IntTwoMerge2((Vec_Int_t *)(lVar10 + lVar11),(Vec_Int_t *)((long)iVar3 * 0x10 + lVar10)
                           ,pVVar5);
          local_98.tv_sec = *(long *)(lVar10 + lVar11);
          local_98.tv_nsec = ((long *)(lVar10 + lVar11))[1];
          piVar6 = pVVar5->pArray;
          *(undefined8 *)(lVar10 + lVar11) = *(undefined8 *)pVVar5;
          ((undefined8 *)(lVar10 + lVar11))[1] = piVar6;
          pVVar5->nCap = (int)local_98.tv_sec;
          pVVar5->nSize = (int)((ulong)local_98.tv_sec >> 0x20);
          pVVar5->pArray = (int *)local_98.tv_nsec;
          lVar12 = lVar12 + 1;
        } while (lVar12 < *(int *)((long)pvVar7 + 0x1c));
      }
      lVar10 = local_38;
    } while (1 < local_40);
  }
  pVVar5 = local_48;
  pAVar2 = local_50;
  __ptr_00 = local_80;
  pVVar8 = local_50->vCis;
  if (pVVar8->nSize < 1) {
    pvVar7 = *(void **)(local_80 + 2);
  }
  else {
    lVar10 = 0;
    do {
      iVar3 = *(int *)((long)pVVar8->pArray[lVar10] + 0x10);
      if (((long)iVar3 < 0) || ((int)__ptr_00[1] <= iVar3)) {
LAB_002ef18a:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pvVar7 = *(void **)(__ptr_00 + 2);
      Vec_IntPush(pVVar5,*(int *)((long)pvVar7 + (long)iVar3 * 0x10 + 4));
      lVar10 = lVar10 + 1;
      pVVar8 = pAVar2->vCis;
    } while (lVar10 < pVVar8->nSize);
  }
  uVar1 = *__ptr_00;
  if ((long)(int)uVar1 < 1) {
    if (pvVar7 == (void *)0x0) goto LAB_002ef0b3;
  }
  else {
    lVar10 = 0;
    do {
      __ptr = *(void **)((long)pvVar7 + lVar10 + 8);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)((long)pvVar7 + lVar10 + 8) = 0;
      }
      lVar10 = lVar10 + 0x10;
    } while ((long)(int)uVar1 * 0x10 != lVar10);
  }
  free(pvVar7);
LAB_002ef0b3:
  free(__ptr_00);
  pVVar8 = local_68;
  if (local_68->pArray != (void **)0x0) {
    free(local_68->pArray);
  }
  free(pVVar8);
  iVar3 = local_5c;
  if (local_70->pArray != (int *)0x0) {
    free(local_70->pArray);
  }
  free(local_70);
  if (iVar3 != 0) {
    iVar9 = 3;
    iVar3 = clock_gettime(3,&local_98);
    if (iVar3 < 0) {
      lVar10 = -1;
    }
    else {
      lVar10 = local_98.tv_nsec / 1000 + local_98.tv_sec * 1000000;
    }
    lVar10 = lVar10 + local_58;
    Abc_Print(iVar9,"%s =","Output support computation");
    Abc_Print(iVar9,"%9.2f sec\n",SUB84((double)lVar10 / 1000000.0,0));
  }
  return pVVar5;
}

Assistant:

Vec_Int_t * Abc_NtkCollectCiSupps( Abc_Ntk_t * pNtk, int fVerbose )
{
    abctime clk = Abc_Clock();
    Abc_Obj_t * pNode; int i, k;
    Vec_Ptr_t * vNodes = Abc_NtkDfs( pNtk, 0 );
    Vec_Int_t * vFanin, * vFanout, * vTemp = Vec_IntAlloc( 0 );
    Vec_Int_t * vSuppsCi = Vec_IntAlloc( Abc_NtkCiNum(pNtk) );
    Vec_Wec_t * vSupps = Vec_WecStart( Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        vFanout = Vec_WecEntry(vSupps, Abc_ObjId(pNode));
        vFanin = Vec_WecEntry(vSupps, Abc_ObjFaninId0(pNode));
        Vec_IntPush( vFanout, i );
        Vec_IntTwoMerge2( vFanin, vFanout, vTemp );
        ABC_SWAP( Vec_Int_t, *vFanin, *vTemp );
    }
    Vec_PtrForEachEntryReverse( Abc_Obj_t *, vNodes, pNode, i )
    {
        vFanout = Vec_WecEntry(vSupps, Abc_ObjId(pNode));
        for ( k = 0; k < Abc_ObjFaninNum(pNode); k++ )
        {
            vFanin = Vec_WecEntry(vSupps, Abc_ObjFaninId(pNode, k));
            Vec_IntTwoMerge2( vFanin, vFanout, vTemp );
            ABC_SWAP( Vec_Int_t, *vFanin, *vTemp );
        }
    }
    Abc_NtkForEachCi( pNtk, pNode, i )
        Vec_IntPush( vSuppsCi, Vec_IntSize(Vec_WecEntry(vSupps, Abc_ObjId(pNode))) );
    Vec_WecFree( vSupps );
    Vec_PtrFree( vNodes );
    Vec_IntFree( vTemp );
    if ( fVerbose )
        Abc_PrintTime( 1, "Output support computation", Abc_Clock() - clk );
    //Vec_IntPrint( vSuppsCi );
    return vSuppsCi;
}